

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_simd_zip_trn(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *pTVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 pTVar6;
  TCGTemp *a3;
  uint uVar7;
  uint element;
  TCGTemp *a1;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uintptr_t o;
  TCGv_i64 tcg_dest;
  MemOp memop;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int base;
  short local_80;
  
  memop = insn >> 0x16 & MO_64;
  uVar2 = insn >> 0x1e & 1;
  uVar13 = uVar2 * 0x40 + 0x40 >> (char)memop + 3;
  uVar7 = insn >> 0xc & 3;
  if ((uVar7 != 0 & (memop != MO_64 | (byte)uVar2)) == 0) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  tcg_ctx = s->uc->tcg_ctx;
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  uVar3 = insn >> 5 & 0x1f;
  uVar12 = 0;
  pTVar5 = tcg_const_i64_aarch64(tcg_ctx,0);
  pTVar6 = tcg_const_i64_aarch64(tcg_ctx,0);
  a3 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  tcg_dest = (TCGv_i64)((long)a3 - (long)tcg_ctx);
  uVar2 = uVar13 >> 1;
  if ((insn & 0x4000) == 0) {
    uVar2 = 0;
  }
  uVar9 = (insn & 0x4000) >> 0xe;
  uVar10 = uVar9;
  do {
    local_80 = (short)uVar7;
    uVar11 = (uint)uVar12;
    uVar8 = uVar3;
    if (local_80 == 3) {
      element = (int)(uVar12 >> 1) + uVar2;
      if ((uVar12 & 1) != 0) goto LAB_006ae848;
    }
    else if (uVar7 == 2) {
      if ((uVar12 & 1) == 0) {
        element = uVar9 + uVar11;
      }
      else {
        element = (uVar11 & 0x7ffffffe) + uVar9;
LAB_006ae848:
        uVar8 = insn >> 0x10 & 0x1f;
      }
    }
    else {
      element = uVar10;
      if (uVar13 >> 1 <= uVar11) {
        element = uVar10 - (uVar13 & 0xfffffffe);
        goto LAB_006ae848;
      }
    }
    read_vec_element(s,tcg_dest,uVar8,element,memop);
    iVar4 = uVar11 << (char)memop + 3;
    if (iVar4 < 0x40) {
      tcg_gen_shli_i64_aarch64(tcg_ctx,tcg_dest,tcg_dest,(long)iVar4);
      a1 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
    }
    else {
      tcg_gen_shli_i64_aarch64(tcg_ctx,tcg_dest,tcg_dest,(ulong)(iVar4 - 0x40));
      a1 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
    }
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_or_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
    uVar12 = (ulong)(uVar11 + 1);
    uVar10 = uVar10 + 2;
    if (uVar13 == uVar11 + 1) {
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
      pTVar1 = s->uc->tcg_ctx;
      iVar4 = (insn & 0x1f) * 0x100;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(TCGArg)(pTVar5 + (long)pTVar1),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(iVar4 + 0xc10));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(TCGArg)(pTVar6 + (long)pTVar1),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(iVar4 + 0xc18));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
      clear_vec_high(s,true,insn & 0x1f);
      return;
    }
  } while( true );
}

Assistant:

static void disas_simd_zip_trn(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int rm = extract32(insn, 16, 5);
    int size = extract32(insn, 22, 2);
    /* opc field bits [1:0] indicate ZIP/UZP/TRN;
     * bit 2 indicates 1 vs 2 variant of the insn.
     */
    int opcode = extract32(insn, 12, 2);
    bool part = extract32(insn, 14, 1);
    bool is_q = extract32(insn, 30, 1);
    int esize = 8 << size;
    int i, ofs;
    int datasize = is_q ? 128 : 64;
    int elements = datasize / esize;
    TCGv_i64 tcg_res, tcg_resl, tcg_resh;

    if (opcode == 0 || (size == 3 && !is_q)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_resl = tcg_const_i64(tcg_ctx, 0);
    tcg_resh = tcg_const_i64(tcg_ctx, 0);
    tcg_res = tcg_temp_new_i64(tcg_ctx);

    for (i = 0; i < elements; i++) {
        switch (opcode) {
        case 1: /* UZP1/2 */
        {
            int midpoint = elements / 2;
            if (i < midpoint) {
                read_vec_element(s, tcg_res, rn, 2 * i + part, size);
            } else {
                read_vec_element(s, tcg_res, rm,
                                 2 * (i - midpoint) + part, size);
            }
            break;
        }
        case 2: /* TRN1/2 */
            if (i & 1) {
                read_vec_element(s, tcg_res, rm, (i & ~1) + part, size);
            } else {
                read_vec_element(s, tcg_res, rn, (i & ~1) + part, size);
            }
            break;
        case 3: /* ZIP1/2 */
        {
            int base = part * elements / 2;
            if (i & 1) {
                read_vec_element(s, tcg_res, rm, base + (i >> 1), size);
            } else {
                read_vec_element(s, tcg_res, rn, base + (i >> 1), size);
            }
            break;
        }
        default:
            g_assert_not_reached();
        }

        ofs = i * esize;
        if (ofs < 64) {
            tcg_gen_shli_i64(tcg_ctx, tcg_res, tcg_res, ofs);
            tcg_gen_or_i64(tcg_ctx, tcg_resl, tcg_resl, tcg_res);
        } else {
            tcg_gen_shli_i64(tcg_ctx, tcg_res, tcg_res, ofs - 64);
            tcg_gen_or_i64(tcg_ctx, tcg_resh, tcg_resh, tcg_res);
        }
    }

    tcg_temp_free_i64(tcg_ctx, tcg_res);

    write_vec_element(s, tcg_resl, rd, 0, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resl);
    write_vec_element(s, tcg_resh, rd, 1, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resh);
    clear_vec_high(s, true, rd);
}